

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<unsigned_long_long>::populate
          (Generators<unsigned_long_long> *this,unsigned_long_long *val)

{
  unsigned_long_long *in_stack_00000008;
  GeneratorWrapper<unsigned_long_long> *in_stack_ffffffffffffffd8;
  vector<Catch::Generators::GeneratorWrapper<unsigned_long_long>,_std::allocator<Catch::Generators::GeneratorWrapper<unsigned_long_long>_>_>
  *in_stack_ffffffffffffffe0;
  
  value<unsigned_long_long>(in_stack_00000008);
  std::
  vector<Catch::Generators::GeneratorWrapper<unsigned_long_long>,std::allocator<Catch::Generators::GeneratorWrapper<unsigned_long_long>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<unsigned_long_long>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  GeneratorWrapper<unsigned_long_long>::~GeneratorWrapper
            ((GeneratorWrapper<unsigned_long_long> *)0x284919);
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }